

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *p_manager)

{
  opj_image_comp_t *poVar1;
  opj_jp2_cmap_comp_t *poVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  opj_jp2_pclr_t *poVar7;
  OPJ_BYTE *pOVar8;
  OPJ_UINT32 *pOVar9;
  OPJ_BYTE *pOVar10;
  opj_jp2_cmap_comp_t *poVar11;
  opj_image_comp_t *ptr;
  OPJ_INT32 *pOVar12;
  OPJ_INT32 *pOVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  OPJ_UINT32 OVar23;
  OPJ_UINT32 OVar24;
  opj_image_comp_t *ptr_00;
  void *pvVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  ushort uVar32;
  OPJ_BOOL OVar33;
  int iVar34;
  
  poVar7 = color->jp2_pclr;
  pOVar8 = poVar7->channel_size;
  pOVar9 = poVar7->entries;
  pOVar10 = poVar7->channel_sign;
  poVar11 = poVar7->cmap;
  bVar3 = poVar7->nr_channels;
  uVar32 = (ushort)bVar3;
  if (bVar3 == 0) {
LAB_0011ce56:
    ptr = image->comps;
    ptr_00 = (opj_image_comp_t *)opj_malloc((ulong)bVar3 << 6);
    if (ptr_00 == (opj_image_comp_t *)0x0) {
LAB_0011d0cc:
      OVar33 = 0;
      opj_event_msg(p_manager,1,"Memory allocation failure in opj_jp2_apply_pclr().\n");
    }
    else {
      if (bVar3 != 0) {
        lVar27 = 0x30;
        uVar26 = 0;
        do {
          uVar28 = (ulong)poVar11[uVar26].pcol;
          uVar5 = poVar11[uVar26].cmp;
          if (poVar11[uVar26].mtyp == '\0') {
            uVar29 = uVar26;
            if (uVar28 != 0) {
              __assert_fail("pcol == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                            ,0x431,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
          }
          else {
            uVar29 = uVar28;
            if (uVar26 != uVar28) {
              __assert_fail("i == pcol",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                            ,0x434,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
          }
          poVar1 = ptr + uVar5;
          OVar21 = poVar1->dx;
          OVar22 = poVar1->dy;
          OVar23 = poVar1->w;
          OVar24 = poVar1->h;
          poVar1 = ptr + uVar5;
          OVar19 = poVar1->x0;
          OVar20 = poVar1->y0;
          uVar14 = *(undefined8 *)(&poVar1->x0 + 2);
          poVar1 = ptr + uVar5;
          OVar17 = poVar1->sgnd;
          OVar18 = poVar1->resno_decoded;
          uVar15 = *(undefined8 *)(&poVar1->sgnd + 2);
          uVar16 = (&ptr[uVar5].data)[1];
          ptr_00[uVar29].data = ptr[uVar5].data;
          (&ptr_00[uVar29].data)[1] = (OPJ_INT32 *)uVar16;
          poVar1 = ptr_00 + uVar29;
          poVar1->sgnd = OVar17;
          poVar1->resno_decoded = OVar18;
          *(undefined8 *)(&poVar1->sgnd + 2) = uVar15;
          poVar1 = ptr_00 + uVar29;
          poVar1->x0 = OVar19;
          poVar1->y0 = OVar20;
          *(undefined8 *)(&poVar1->x0 + 2) = uVar14;
          poVar1 = ptr_00 + uVar29;
          poVar1->dx = OVar21;
          poVar1->dy = OVar22;
          poVar1->w = OVar23;
          poVar1->h = OVar24;
          pvVar25 = opj_image_data_alloc((ulong)ptr[uVar5].h * (ulong)ptr[uVar5].w * 4);
          *(void **)((long)&ptr_00->dx + lVar27) = pvVar25;
          if (pvVar25 == (void *)0x0) {
            if (uVar26 != 0) {
              lVar27 = lVar27 + -0x30;
              do {
                opj_image_data_free(*(void **)((long)ptr_00 + lVar27 + -0x10));
                lVar27 = lVar27 + -0x40;
              } while (lVar27 != 0);
            }
            opj_free(ptr_00);
            goto LAB_0011d0cc;
          }
          *(uint *)((long)ptr_00 + lVar27 + -0x18) = (uint)pOVar8[uVar26];
          *(uint *)((long)ptr_00 + lVar27 + -0x10) = (uint)pOVar10[uVar26];
          uVar26 = uVar26 + 1;
          lVar27 = lVar27 + 0x40;
        } while (uVar32 != uVar26);
      }
      if (bVar3 != 0) {
        uVar5 = color->jp2_pclr->nr_entries;
        uVar26 = 0;
        do {
          pOVar12 = ptr[poVar11[uVar26].cmp].data;
          if (pOVar12 == (OPJ_INT32 *)0x0) {
            __assert_fail("src",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                          ,0x450,
                          "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                         );
          }
          bVar4 = poVar11[uVar26].pcol;
          uVar30 = ptr_00[bVar4].h * ptr_00[bVar4].w;
          uVar31 = (uint)uVar26;
          if (poVar11[uVar26].mtyp == '\0') {
            lVar27 = *(long *)((long)&ptr_00->data + (ulong)(uVar31 << 6));
            if (lVar27 == 0) {
              __assert_fail("dst",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                            ,0x456,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
            if (uVar30 != 0) {
              uVar26 = 0;
              do {
                *(OPJ_INT32 *)(lVar27 + uVar26 * 4) = pOVar12[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar30 != uVar26);
            }
          }
          else {
            if (uVar31 != bVar4) {
              __assert_fail("i == pcol",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                            ,0x45b,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
            pOVar13 = ptr_00[bVar4].data;
            if (pOVar13 == (OPJ_INT32 *)0x0) {
              __assert_fail("dst",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                            ,0x45d,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
            if (uVar30 != 0) {
              uVar26 = 0;
              do {
                iVar6 = pOVar12[uVar26];
                iVar34 = uVar5 - 1;
                if (iVar6 < (int)(uint)uVar5) {
                  iVar34 = iVar6;
                }
                if (iVar6 < 0) {
                  iVar34 = 0;
                }
                pOVar13[uVar26] = pOVar9[(int)(iVar34 * (uint)bVar3 + (uint)bVar4)];
                uVar26 = uVar26 + 1;
              } while (uVar30 != uVar26);
            }
          }
          uVar26 = (ulong)(uVar31 + 1 & 0xffff);
        } while ((ushort)(uVar31 + 1) < uVar32);
      }
      uVar30 = image->numcomps;
      if (uVar30 != 0) {
        uVar32 = 0;
        do {
          if (ptr[uVar32].data != (OPJ_INT32 *)0x0) {
            opj_image_data_free(ptr[uVar32].data);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 < uVar30);
      }
      opj_free(ptr);
      image->comps = ptr_00;
      image->numcomps = (uint)bVar3;
      OVar33 = 1;
    }
  }
  else {
    OVar33 = 0;
    uVar26 = 0;
    if (image->comps[poVar11->cmp].data != (OPJ_INT32 *)0x0) {
      lVar27 = 1;
      do {
        if (uVar32 <= (ushort)lVar27) goto LAB_0011ce56;
        poVar2 = poVar11 + lVar27;
        lVar27 = lVar27 + 1;
      } while (image->comps[poVar2->cmp].data != (OPJ_INT32 *)0x0);
      uVar26 = (ulong)((int)lVar27 - 1);
    }
    opj_event_msg(p_manager,1,"image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n",uVar26);
  }
  return OVar33;
}

Assistant:

static OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,
                                   opj_jp2_color_t *color,
                                   opj_event_mgr_t * p_manager)
{
    opj_image_comp_t *old_comps, *new_comps;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    opj_jp2_cmap_comp_t *cmap;
    OPJ_INT32 *src, *dst;
    OPJ_UINT32 j, max;
    OPJ_UINT16 i, nr_channels, cmp, pcol;
    OPJ_INT32 k, top_k;

    channel_size = color->jp2_pclr->channel_size;
    channel_sign = color->jp2_pclr->channel_sign;
    entries = color->jp2_pclr->entries;
    cmap = color->jp2_pclr->cmap;
    nr_channels = color->jp2_pclr->nr_channels;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        if (image->comps[cmp].data == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n", i);
            return OPJ_FALSE;
        }
    }

    old_comps = image->comps;
    new_comps = (opj_image_comp_t*)
                opj_malloc(nr_channels * sizeof(opj_image_comp_t));
    if (!new_comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Memory allocation failure in opj_jp2_apply_pclr().\n");
        return OPJ_FALSE;
    }
    for (i = 0; i < nr_channels; ++i) {
        pcol = cmap[i].pcol;
        cmp = cmap[i].cmp;

        /* Direct use */
        if (cmap[i].mtyp == 0) {
            assert(pcol == 0);
            new_comps[i] = old_comps[cmp];
        } else {
            assert(i == pcol);
            new_comps[pcol] = old_comps[cmp];
        }

        /* Palette mapping: */
        new_comps[i].data = (OPJ_INT32*)
                            opj_image_data_alloc(sizeof(OPJ_INT32) * old_comps[cmp].w * old_comps[cmp].h);
        if (!new_comps[i].data) {
            while (i > 0) {
                -- i;
                opj_image_data_free(new_comps[i].data);
            }
            opj_free(new_comps);
            opj_event_msg(p_manager, EVT_ERROR,
                          "Memory allocation failure in opj_jp2_apply_pclr().\n");
            return OPJ_FALSE;
        }
        new_comps[i].prec = channel_size[i];
        new_comps[i].sgnd = channel_sign[i];
    }

    top_k = color->jp2_pclr->nr_entries - 1;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        pcol = cmap[i].pcol;
        src = old_comps[cmp].data;
        assert(src); /* verified above */
        max = new_comps[pcol].w * new_comps[pcol].h;

        /* Direct use: */
        if (cmap[i].mtyp == 0) {
            dst = new_comps[i].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                dst[j] = src[j];
            }
        } else {
            assert(i == pcol);
            dst = new_comps[pcol].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                /* The index */
                if ((k = src[j]) < 0) {
                    k = 0;
                } else if (k > top_k) {
                    k = top_k;
                }

                /* The colour */
                dst[j] = (OPJ_INT32)entries[k * nr_channels + pcol];
            }
        }
    }

    max = image->numcomps;
    for (i = 0; i < max; ++i) {
        if (old_comps[i].data) {
            opj_image_data_free(old_comps[i].data);
        }
    }

    opj_free(old_comps);
    image->comps = new_comps;
    image->numcomps = nr_channels;

    return OPJ_TRUE;
}